

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void run_test<unsigned_int>(void)

{
  uint32_t uVar1;
  size_t sVar2;
  DivideTest<unsigned_int> dt;
  char msg [64];
  DivideTest<unsigned_int> local_50;
  char local_48 [64];
  
  snprintf(local_48,0x40,"Testing %s\n","uint32_t");
  sVar2 = strlen(local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar2);
  local_50.seed = 0;
  local_50.rand_n = 0;
  uVar1 = DivideTest<unsigned_int>::randomSeed();
  local_50.seed = uVar1;
  uVar1 = DivideTest<unsigned_int>::randomSeed();
  local_50.rand_n = uVar1;
  DivideTest<unsigned_int>::run(&local_50);
  return;
}

Assistant:

void run_test() {
    char msg[64];
    snprintf(msg, sizeof(msg), "Testing %s\n", type_name<T>::get_name());
    PRINT_INFO(msg);
    DivideTest<T> dt;
    dt.run();
}